

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

CURLcode Curl_creader_unpause(Curl_easy *data)

{
  CURLcode local_1c;
  Curl_creader *pCStack_18;
  CURLcode result;
  Curl_creader *reader;
  Curl_easy *data_local;
  
  pCStack_18 = (data->req).reader_stack;
  local_1c = CURLE_OK;
  while ((pCStack_18 != (Curl_creader *)0x0 &&
         (local_1c = (*pCStack_18->crt->unpause)(data,pCStack_18), local_1c == CURLE_OK))) {
    pCStack_18 = pCStack_18->next;
  }
  return local_1c;
}

Assistant:

CURLcode Curl_creader_unpause(struct Curl_easy *data)
{
  struct Curl_creader *reader = data->req.reader_stack;
  CURLcode result = CURLE_OK;

  while(reader) {
    result = reader->crt->unpause(data, reader);
    if(result)
      break;
    reader = reader->next;
  }
  return result;
}